

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O1

ParseStackGenericElement * __thiscall
SGParser::Parse<SGParser::ParseStackGenericElement>::operator[]
          (Parse<SGParser::ParseStackGenericElement> *this,IndexType index)

{
  size_t sVar1;
  
  sVar1 = this->StackPosition;
  if (SBORROW8(sVar1,-index) != (long)(sVar1 + index) < 0) {
    __assert_fail("-index <= IndexType(StackPosition)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                  ,0xc4,
                  "StackElement &SGParser::Parse<SGParser::ParseStackGenericElement>::operator[](IndexType)"
                 );
  }
  if (index < (long)(this->StackSize - sVar1)) {
    return this->pStack + sVar1 + index;
  }
  __assert_fail("index < GetMaxAllowedIndex()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                ,0xc5,
                "StackElement &SGParser::Parse<SGParser::ParseStackGenericElement>::operator[](IndexType)"
               );
}

Assistant:

StackElement&       operator[](IndexType index) {
        SG_ASSERT(-index <= IndexType(StackPosition));
        SG_ASSERT(index < GetMaxAllowedIndex());
        return pStack[StackPosition + index];
    }